

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O3

int64_t primesum::pi_lmo5(int64_t x)

{
  BitSieve *pBVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  int256_t res;
  ulong uVar6;
  uint64_t uVar7;
  int128_t *piVar8;
  uint64_t uVar9;
  long lVar10;
  long lVar11;
  uint64_t prime;
  long lVar12;
  long lVar13;
  uint64_t low;
  uint64_t x_04;
  int64_t m;
  ulong uVar14;
  int128_t *piVar15;
  int64_t iVar16;
  size_t size;
  BitSieve sieve;
  vector<int,_std::allocator<int>_> primes;
  vector<long,_std::allocator<long>_> phi;
  size_type __dnew;
  vector<int,_std::allocator<int>_> pi;
  Wheel wheel;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined1 local_1f0 [32];
  double local_1d0;
  uint64_t local_1c8;
  long local_1c0;
  uint64_t local_1b8;
  int128_t *local_1b0;
  long local_1a8;
  long local_1a0;
  vector<int,_std::allocator<int>_> local_198;
  long local_180;
  int64_t local_178;
  vector<long,_std::allocator<long>_> local_170;
  string local_158;
  vector<int,_std::allocator<int>_> local_138;
  Wheel local_120;
  double local_108;
  long local_100;
  size_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  long local_e0;
  pointer local_d8;
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar16 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffdf0;
    x_00._0_8_ = in_stack_fffffffffffffde8;
    local_1d0 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar5 = pow((double)x,0.3333333333333333);
    lVar10 = (long)dVar5;
    if (0 < lVar10) {
      do {
        if (lVar10 * lVar10 - x / lVar10 == 0 || lVar10 * lVar10 < x / lVar10) goto LAB_00120a19;
        bVar4 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar4);
      lVar10 = 0;
    }
LAB_00120a19:
    lVar10 = lVar10 + -1;
    do {
      lVar11 = lVar10 + 2;
      lVar10 = lVar10 + 1;
    } while (lVar11 * lVar11 - x / lVar11 == 0 || lVar11 * lVar11 < x / lVar11);
    piVar15 = (int128_t *)(long)(local_1d0 * (double)lVar10);
    local_1c0 = x / (long)piVar15;
    local_1c8 = 6;
    if ((long)piVar15 < 0xd) {
      local_1c8 = (uint64_t)(int)(&PhiTiny::pi)[(long)piVar15];
    }
    pBVar1 = (BitSieve *)(local_1f0 + 0x10);
    local_1f0._0_8_ = pBVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
    print((string *)local_1f0);
    if ((BitSieve *)local_1f0._0_8_ != pBVar1) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    local_1f0._0_8_ = pBVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"=== pi_lmo5(x) ===","");
    print((string *)local_1f0);
    if ((BitSieve *)local_1f0._0_8_ != pBVar1) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    local_1f0._0_8_ = pBVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"pi(x) = S1 + S2 + pi(y) - 1 - P2","");
    print((string *)local_1f0);
    if ((BitSieve *)local_1f0._0_8_ != pBVar1) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    x_01._8_8_ = in_stack_fffffffffffffdf0;
    x_01._0_8_ = in_stack_fffffffffffffde8;
    print((primesum *)x,(int128_t)x_01,0,(int64_t)piVar15,local_1c0,local_1d0,(int)local_1c8);
    x_02._8_8_ = in_stack_fffffffffffffdf0;
    x_02._0_8_ = in_stack_fffffffffffffde8;
    P2(&local_58,(primesum *)x,(int128_t)x_02,0,(int)piVar15);
    generate_moebius(&local_b0,(int64_t)piVar15);
    generate_lpf(&local_c8,(int64_t)piVar15);
    generate_primes(&local_198,(int64_t)piVar15);
    x_03._8_8_ = in_stack_fffffffffffffdf0;
    x_03._0_8_ = in_stack_fffffffffffffde8;
    S1(&local_78,(primesum *)x,(int128_t)x_03,0,(int64_t)piVar15,(int)local_1c8);
    local_1f0._8_8_ = (pointer)0x0;
    local_1f0._16_8_ = local_1f0._16_8_ & 0xffffffffffffff00;
    local_1f0._0_8_ = pBVar1;
    print((string *)local_1f0);
    if ((BitSieve *)local_1f0._0_8_ != pBVar1) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    local_158._M_dataplus._M_p = (pointer)0x10;
    local_1f0._0_8_ = pBVar1;
    local_1f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1f0,(ulong)&local_158);
    local_1f0._16_8_ = local_158._M_dataplus._M_p;
    (((BitSieve *)local_1f0._0_8_)->sieve_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x78283253203d3d3d;
    (((BitSieve *)local_1f0._0_8_)->sieve_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3d3d3d202979202c;
    local_1f0._8_8_ = local_158._M_dataplus._M_p;
    local_158._M_dataplus._M_p[(long)&((BitSieve *)local_1f0._0_8_)->sieve_] = '\0';
    print((string *)local_1f0);
    if ((BitSieve *)local_1f0._0_8_ != pBVar1) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    local_158._M_dataplus._M_p = (pointer)0x21;
    local_1f0._0_8_ = pBVar1;
    local_1f0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1f0,(ulong)&local_158);
    local_1f0._16_8_ = local_158._M_dataplus._M_p;
    (((BitSieve *)local_1f0._0_8_)->sieve_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x6963657073206568;
    ((BitSieve *)local_1f0._0_8_)->size_ = 0x657661656c206c61;
    (((BitSieve *)local_1f0._0_8_)->sieve_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x74617475706d6f43;
    (((BitSieve *)local_1f0._0_8_)->sieve_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7420666f206e6f69;
    *(undefined1 *)
     &(((BitSieve *)(local_1f0._0_8_ + 0x20))->sieve_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = 0x73;
    local_1f0._8_8_ = local_158._M_dataplus._M_p;
    local_158._M_dataplus._M_p[(long)&((BitSieve *)local_1f0._0_8_)->sieve_] = '\0';
    print((string *)local_1f0);
    if ((BitSieve *)local_1f0._0_8_ != pBVar1) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    local_108 = get_time();
    uVar9 = local_1c0 + 1;
    dVar5 = (double)(long)uVar9;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    lVar10 = 0xb504f333;
    if ((long)dVar5 < 0xb504f333) {
      lVar10 = (long)dVar5;
    }
    lVar11 = lVar10 * 2;
    do {
      lVar12 = lVar10 * lVar10;
      lVar11 = lVar11 + -2;
      lVar13 = lVar10;
      lVar10 = lVar10 + -1;
    } while (lVar12 - uVar9 != 0 && (long)uVar9 <= lVar12);
    do {
      lVar10 = lVar13;
      lVar11 = lVar11 + 2;
      lVar13 = lVar10 + 1;
    } while (lVar11 < (long)(uVar9 - lVar10 * lVar10));
    size = 1;
    if (lVar10 + 1 != 1) {
      uVar6 = lVar10 - 1;
      lVar10 = 1;
      do {
        uVar6 = (long)uVar6 >> ((byte)lVar10 & 0x3f) | uVar6;
        bVar4 = lVar10 < 0x20;
        lVar10 = lVar10 * 2;
      } while (bVar4);
      size = uVar6 + 1;
    }
    BitSieve::BitSieve((BitSieve *)local_1f0,size);
    Wheel::Wheel<std::vector<int,std::allocator<int>>>
              (&local_120,&local_198,
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,1);
    generate_pi(&local_138,(int64_t)piVar15);
    local_158._M_dataplus._M_p = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::vector
              (&local_170,
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict7 *)&local_158,
               (allocator_type *)&local_98);
    dVar5 = (double)(long)piVar15;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    lVar10 = 0xb504f333;
    if ((long)dVar5 < 0xb504f333) {
      lVar10 = (long)dVar5;
    }
    lVar11 = lVar10 * 2;
    do {
      lVar13 = lVar10 * lVar10;
      lVar10 = lVar10 + -1;
      lVar11 = lVar11 + -2;
    } while (lVar13 - (long)piVar15 != 0 && (long)piVar15 <= lVar13);
    do {
      lVar10 = lVar10 + 1;
      x_04 = (long)piVar15 - lVar10 * lVar10;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)x_04);
    local_1b0 = piVar15;
    if (local_1c0 < 1) {
      local_1d0 = 0.0;
    }
    else {
      local_1a8 = (long)*(int *)((long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar11 * 2);
      local_180 = (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar15];
      local_100 = local_1c8 + 1;
      local_1d0 = 0.0;
      low = 1;
      local_178 = x;
      local_f8 = size;
      local_f0 = uVar9;
      do {
        uVar9 = local_f8 + low;
        local_1b8 = uVar9;
        if ((long)local_f0 < (long)uVar9) {
          local_1b8 = local_f0;
        }
        x_04 = local_1c8;
        BitSieve::pre_sieve((BitSieve *)local_1f0,local_1c8,low);
        lVar10 = local_100;
        local_e8 = uVar9;
        if (local_100 < local_1a8) {
          local_e0 = local_1b8 - low;
          uVar9 = local_1b8;
          lVar11 = local_100;
          do {
            iVar2 = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
            lVar10 = (long)iVar2;
            uVar7 = x / (long)(uVar9 * lVar10);
            x_04 = (long)piVar15 / lVar10;
            if ((long)piVar15 / lVar10 < (long)uVar7) {
              x_04 = uVar7;
            }
            piVar8 = (int128_t *)(x / (long)(low * lVar10));
            if ((long)piVar15 <= (long)piVar8) {
              piVar8 = piVar15;
            }
            if ((long)piVar8 <= lVar10) goto LAB_0012123f;
            if ((long)x_04 < (long)piVar8) {
              uVar6 = 0;
              local_d0 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_d8 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              do {
                iVar3 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar8];
                if (((long)iVar3 != 0) &&
                   (iVar2 < local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)piVar8])) {
                  lVar13 = local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11];
                  for (; (long)uVar6 <= (long)(x / ((long)piVar8 * lVar10) - low); uVar6 = uVar6 + 2
                      ) {
                    uVar14 = (&BitSieve::set_bit_)[(uint)uVar6 & 0x7f] &
                             *(ulong *)(local_1f0._0_8_ + (uVar6 >> 7) * 8);
                    if (uVar14 != 0) {
                      uVar14 = uVar6 + low;
                    }
                    lVar13 = lVar13 + uVar14;
                    local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11] = lVar13;
                  }
                  local_1d0 = (double)((long)local_1d0 -
                                      (long)piVar8 * lVar10 * (long)iVar3 * lVar13);
                  x = local_178;
                }
                piVar8 = (int128_t *)((long)piVar8 + -1);
                uVar9 = local_1b8;
                piVar15 = local_1b0;
                local_1a0 = lVar10;
              } while ((long)x_04 < (long)piVar8);
            }
            else {
              uVar6 = 0;
            }
            if ((long)uVar6 < local_e0) {
              lVar13 = local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11];
              do {
                uVar14 = (&BitSieve::set_bit_)[(uint)uVar6 & 0x7f] &
                         *(ulong *)(local_1f0._0_8_ + (uVar6 >> 7) * 8);
                if (uVar14 != 0) {
                  uVar14 = uVar6 + low;
                }
                lVar13 = lVar13 + uVar14;
                local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11] = lVar13;
                uVar6 = uVar6 + 2;
              } while ((long)uVar6 < local_e0);
            }
            x_04 = low;
            anon_unknown.dwarf_e0250::cross_off
                      ((BitSieve *)local_1f0._0_8_,low,uVar9,lVar10,
                       local_120.wheel_.
                       super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar11);
            lVar11 = lVar11 + 1;
            lVar10 = local_1a8;
          } while (lVar11 != local_1a8);
        }
        if (lVar10 < local_180) {
          local_1a0 = local_1b8 - low;
          uVar9 = local_1b8;
          do {
            uVar7 = local_1b8;
            prime = (uint64_t)
                    local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10];
            piVar8 = (int128_t *)(x / (long)(low * prime));
            if ((long)piVar15 <= (long)piVar8) {
              piVar8 = piVar15;
            }
            lVar11 = (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)piVar8];
            uVar9 = x / (long)(uVar9 * prime);
            x_04 = (long)piVar15 / (long)prime;
            if ((long)piVar15 / (long)prime <= (long)prime) {
              x_04 = prime;
            }
            if ((long)x_04 <= (long)uVar9) {
              x_04 = uVar9;
            }
            lVar13 = (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11];
            if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11] <=
                local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10]) break;
            if ((long)x_04 < lVar13) {
              lVar12 = local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10];
              uVar6 = 0;
              do {
                for (; (long)uVar6 <= (long)(x / (long)(lVar13 * prime) - low); uVar6 = uVar6 + 2) {
                  uVar14 = (&BitSieve::set_bit_)[(uint)uVar6 & 0x7f] &
                           *(ulong *)(local_1f0._0_8_ + (uVar6 >> 7) * 8);
                  if (uVar14 != 0) {
                    uVar14 = uVar6 + low;
                  }
                  lVar12 = lVar12 + uVar14;
                  local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10] = lVar12;
                }
                local_1d0 = (double)((long)local_1d0 + lVar13 * prime * lVar12);
                lVar13 = (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar11 + -1];
                lVar11 = lVar11 + -1;
                x = local_178;
                piVar15 = local_1b0;
              } while ((long)x_04 < lVar13);
            }
            else {
              uVar6 = 0;
            }
            if ((long)uVar6 < local_1a0) {
              lVar11 = local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10];
              do {
                uVar14 = (&BitSieve::set_bit_)[(uint)uVar6 & 0x7f] &
                         *(ulong *)(local_1f0._0_8_ + (uVar6 >> 7) * 8);
                if (uVar14 != 0) {
                  uVar14 = uVar6 + low;
                }
                lVar11 = lVar11 + uVar14;
                local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10] = lVar11;
                uVar6 = uVar6 + 2;
              } while ((long)uVar6 < local_1a0);
            }
            x_04 = low;
            anon_unknown.dwarf_e0250::cross_off
                      ((BitSieve *)local_1f0._0_8_,low,local_1b8,prime,
                       local_120.wheel_.
                       super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar10);
            lVar10 = lVar10 + 1;
            uVar9 = uVar7;
          } while (lVar10 != local_180);
        }
LAB_0012123f:
        low = local_e8;
      } while ((long)local_e8 <= local_1c0);
    }
    dVar5 = local_1d0;
    local_158.field_2._M_allocated_capacity._0_2_ = 0x3253;
    local_158._M_string_length = 2;
    local_158.field_2._M_local_buf[2] = '\0';
    local_98 = (long)local_1d0;
    lStack_90 = (long)local_1d0 >> 0x3f;
    res.high._0_8_ = lStack_90;
    res.low = (uint128_t)SEXT816((long)local_1d0);
    res.high._8_8_ = lStack_90;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_88 = lStack_90;
    lStack_80 = lStack_90;
    print(&local_158,res,local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      x_04 = CONCAT53(local_158.field_2._M_allocated_capacity._3_5_,
                      CONCAT12(local_158.field_2._M_local_buf[2],
                               local_158.field_2._M_allocated_capacity._0_2_)) + 1;
      operator_delete(local_158._M_dataplus._M_p,x_04);
    }
    if (local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      x_04 = (long)local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
      operator_delete(local_170.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,x_04);
    }
    if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      x_04 = (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,x_04);
    }
    if (local_120.wheel_.
        super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      x_04 = (long)local_120.wheel_.
                   super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_120.wheel_.
                   super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      operator_delete(local_120.wheel_.
                      super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                      _M_impl.super__Vector_impl_data._M_start,x_04);
    }
    if ((BitSieve *)local_1f0._0_8_ != (BitSieve *)0x0) {
      x_04 = local_1f0._16_8_ - local_1f0._0_8_;
      operator_delete((void *)local_1f0._0_8_,x_04);
    }
    piVar15 = prime_sum_tiny(local_1b0,x_04);
    if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar16 = (long)piVar15 + (long)dVar5 + ~(ulong)local_58.low + (long)local_78.low;
  }
  return iVar16;
}

Assistant:

int64_t pi_lmo5(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo5(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, 1);

  int256_t p2 = P2(x, y, 1);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}